

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txreconciliation.cpp
# Opt level: O1

uint64_t __thiscall TxReconciliationTracker::Impl::PreRegisterPeer(Impl *this,NodeId peer_id)

{
  unordered_map<long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>_>
  *this_00;
  __node_base *p_Var1;
  size_type *psVar2;
  _Hash_node_base *p_Var3;
  __buckets_ptr pp_Var4;
  NodeId NVar5;
  bool bVar6;
  Logger *this_01;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  __node_base_ptr p_Var9;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var10;
  ulong uVar11;
  size_type __n;
  _Hash_node_base _Var12;
  ulong uVar13;
  pointer __ptr_1;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  undefined1 auVar14 [16];
  NodeId peer_id_local;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock12;
  __buckets_alloc_type __alloc;
  ChaCha20 local_b0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock12.super_unique_lock._M_owns = false;
  peer_id_local = peer_id;
  criticalblock12.super_unique_lock._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&criticalblock12.super_unique_lock);
  this_01 = LogInstance();
  bVar6 = BCLog::Logger::WillLogCategoryLevel(this_01,TXRECONCILIATION,Debug);
  if (bVar6) {
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/txreconciliation.cpp"
    ;
    source_file._M_len = 0x69;
    logging_function._M_str = "PreRegisterPeer";
    logging_function._M_len = 0xf;
    LogPrintFormatInternal<long>
              (logging_function,source_file,0x57,TXRECONCILIATION,Debug,
               (ConstevalFormatString<1U>)0xfb8fc3,&peer_id_local);
  }
  FastRandomContext::FastRandomContext((FastRandomContext *)&__alloc,false);
  p_Var7 = (_Hash_node_base *)FastRandomContext::rand64((FastRandomContext *)&__alloc);
  ChaCha20::~ChaCha20(&local_b0);
  p_Var8 = (_Hash_node_base *)operator_new(0x30);
  NVar5 = peer_id_local;
  this_00 = &this->m_states;
  p_Var8->_M_nxt = (_Hash_node_base *)0x0;
  p_Var8[1]._M_nxt = (_Hash_node_base *)peer_id_local;
  p_Var8[2]._M_nxt = p_Var7;
  *(undefined1 *)&p_Var8[5]._M_nxt = 0;
  uVar13 = (this->m_states)._M_h._M_bucket_count;
  uVar11 = (ulong)peer_id_local % uVar13;
  p_Var9 = std::
           _Hashtable<long,_std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>,_std::allocator<std::pair<const_long,_std::variant<unsigned_long,_(anonymous_namespace)::TxReconciliationState>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&this_00->_M_h,uVar11,(key_type_conflict4 *)(p_Var8 + 1),
                      (__hash_code)(p_Var8 + 1));
  if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
    auVar14 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->m_states)._M_h._M_rehash_policy,uVar13,
                         (this->m_states)._M_h._M_element_count);
    __n = auVar14._8_8_;
    if ((auVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        __s = &(this->m_states)._M_h._M_single_bucket;
        (this->m_states)._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        ((new_allocator<std::__detail::_Hash_node_base_*> *)&__alloc,__n,(void *)0x0
                        );
        memset(__s,0,__n * 8);
      }
      _Var12._M_nxt = (this->m_states)._M_h._M_before_begin._M_nxt;
      (this->m_states)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (_Var12._M_nxt != (_Hash_node_base *)0x0) {
        p_Var1 = &(this->m_states)._M_h._M_before_begin;
        uVar13 = 0;
        do {
          p_Var3 = (_Var12._M_nxt)->_M_nxt;
          uVar11 = (ulong)_Var12._M_nxt[1]._M_nxt % __n;
          if (__s[uVar11] == (_Hash_node_base *)0x0) {
            (_Var12._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var12._M_nxt;
            __s[uVar11] = p_Var1;
            if ((_Var12._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var10 = __s + uVar13;
              goto LAB_00983c18;
            }
          }
          else {
            (_Var12._M_nxt)->_M_nxt = __s[uVar11]->_M_nxt;
            pp_Var10 = &__s[uVar11]->_M_nxt;
            uVar11 = uVar13;
LAB_00983c18:
            *pp_Var10 = _Var12._M_nxt;
          }
          _Var12._M_nxt = p_Var3;
          uVar13 = uVar11;
        } while (p_Var3 != (_Hash_node_base *)0x0);
      }
      pp_Var4 = (this->m_states)._M_h._M_buckets;
      if (&(this->m_states)._M_h._M_single_bucket != pp_Var4) {
        operator_delete(pp_Var4,(this->m_states)._M_h._M_bucket_count << 3);
      }
      (this->m_states)._M_h._M_bucket_count = __n;
      (this->m_states)._M_h._M_buckets = __s;
      uVar11 = (ulong)NVar5 % __n;
    }
    pp_Var4 = (this_00->_M_h)._M_buckets;
    if (pp_Var4[uVar11] == (__node_base_ptr)0x0) {
      p_Var3 = (this->m_states)._M_h._M_before_begin._M_nxt;
      p_Var8->_M_nxt = p_Var3;
      (this->m_states)._M_h._M_before_begin._M_nxt = p_Var8;
      if (p_Var3 != (_Hash_node_base *)0x0) {
        pp_Var4[(ulong)p_Var3[1]._M_nxt % (this->m_states)._M_h._M_bucket_count] = p_Var8;
      }
      (this_00->_M_h)._M_buckets[uVar11] = &(this->m_states)._M_h._M_before_begin;
    }
    else {
      p_Var8->_M_nxt = pp_Var4[uVar11]->_M_nxt;
      pp_Var4[uVar11]->_M_nxt = p_Var8;
    }
    psVar2 = &(this->m_states)._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
    p_Var8 = (_Hash_node_base *)0x0;
  }
  if (p_Var8 != (_Hash_node_base *)0x0) {
    operator_delete(p_Var8,0x30);
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock12.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (uint64_t)p_Var7;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_txreconciliation_mutex)
    {
        AssertLockNotHeld(m_txreconciliation_mutex);
        LOCK(m_txreconciliation_mutex);

        LogPrintLevel(BCLog::TXRECONCILIATION, BCLog::Level::Debug, "Pre-register peer=%d\n", peer_id);
        const uint64_t local_salt{FastRandomContext().rand64()};

        // We do this exactly once per peer (which are unique by NodeId, see GetNewNodeId) so it's
        // safe to assume we don't have this record yet.
        Assume(m_states.emplace(peer_id, local_salt).second);
        return local_salt;
    }